

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t parse_filter_data(archive_read *a,rar5 *rar,uint8_t *p,uint32_t *filter_data)

{
  ushort local_42;
  uint32_t local_40;
  wchar_t wStack_3c;
  uint16_t byte;
  uint32_t data;
  wchar_t ret;
  wchar_t bytes;
  wchar_t i;
  uint32_t *filter_data_local;
  uint8_t *p_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  local_40 = 0;
  _bytes = filter_data;
  filter_data_local = (uint32_t *)p;
  p_local = (uint8_t *)rar;
  rar_local = (rar5 *)a;
  a_local._4_4_ = read_consume_bits(a,rar,p,L'\x02',(wchar_t *)&data);
  if (a_local._4_4_ == L'\0') {
    data = data + 1;
    wStack_3c = L'\0';
    for (ret = L'\0'; ret < (int)data; ret = ret + L'\x01') {
      wStack_3c = read_bits_16((archive_read *)rar_local,(rar5 *)p_local,
                               (uint8_t *)filter_data_local,&local_42);
      if (wStack_3c != L'\0') {
        return wStack_3c;
      }
      local_40 = ((uint)(local_42 >> 8) << ((byte)(ret << 3) & 0x1f)) + local_40;
      skip_bits((rar5 *)p_local,L'\b');
    }
    *_bytes = local_40;
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int parse_filter_data(struct archive_read* a, struct rar5* rar,
	const uint8_t* p, uint32_t* filter_data)
{
	int i, bytes, ret;
	uint32_t data = 0;

	if(ARCHIVE_OK != (ret = read_consume_bits(a, rar, p, 2, &bytes)))
		return ret;

	bytes++;

	for(i = 0; i < bytes; i++) {
		uint16_t byte;

		if(ARCHIVE_OK != (ret = read_bits_16(a, rar, p, &byte))) {
			return ret;
		}

		/* Cast to uint32_t will ensure the shift operation will not
		 * produce undefined result. */
		data += ((uint32_t) byte >> 8) << (i * 8);
		skip_bits(rar, 8);
	}

	*filter_data = data;
	return ARCHIVE_OK;
}